

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkPrintNodes(Wlc_Ntk_t *p,int Type)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pWVar5;
  long lVar6;
  undefined1 *puVar7;
  int *piVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  pcVar3 = Wlc_Names[Type];
  printf("Operation %s\n",pcVar3);
  if (1 < p->iObj) {
    uVar11 = 1;
    lVar12 = 0x28;
    uVar10 = 0;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar11) goto LAB_002fb1f4;
      pWVar4 = p->pObjs;
      if ((*(ushort *)((long)pWVar4 + lVar12 + -0x10) & 0x3f) == Type) {
        printf("%8d  :",(ulong)uVar10);
        printf("%8d  :  ",uVar11 & 0xffffffff);
        pcVar9 = "s";
        if ((*(ushort *)((long)pWVar4 + lVar12 + -0x10) & 0x40) == 0) {
          pcVar9 = " ";
        }
        printf("%3d%s = ",
               (ulong)((*(int *)((long)pWVar4 + lVar12 + -8) - *(int *)((long)pWVar4 + lVar12 + -4))
                      + 1),pcVar9);
        uVar1 = *(uint *)((long)pWVar4 + lVar12 + -0xc);
        if ((uVar1 < 3) && ((*(ushort *)((long)pWVar4 + lVar12 + -0x10) & 0x3f) != 6)) {
          piVar8 = (int *)(&pWVar4->field_0x0 + lVar12);
        }
        else {
          piVar8 = *(int **)(&pWVar4->field_0x0 + lVar12);
        }
        lVar6 = (long)*piVar8;
        if ((lVar6 < 1) || (p->nObjsAlloc <= *piVar8)) {
LAB_002fb1f4:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                        ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        if ((uVar1 < 3) && ((*(ushort *)((long)pWVar4 + lVar12 + -0x10) & 0x3f) != 6)) {
          piVar8 = (int *)(&pWVar4->field_0x0 + lVar12);
        }
        else {
          piVar8 = *(int **)(&pWVar4->field_0x0 + lVar12);
        }
        iVar2 = *piVar8;
        if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_002fb1f4;
        pWVar5 = p->pObjs;
        pcVar9 = "s";
        if ((undefined1  [24])((undefined1  [24])pWVar5[iVar2] & (undefined1  [24])0x40) ==
            (undefined1  [24])0x0) {
          pcVar9 = " ";
        }
        printf("%3d%s  %s ",(ulong)((pWVar5[lVar6].End - pWVar5[lVar6].Beg) + 1),pcVar9,pcVar3);
        uVar1 = *(uint *)((long)pWVar4 + lVar12 + -0xc);
        if ((uVar1 < 3) && ((*(ushort *)((long)pWVar4 + lVar12 + -0x10) & 0x3f) != 6)) {
          puVar7 = &pWVar4->field_0x0 + lVar12;
        }
        else {
          puVar7 = *(undefined1 **)(&pWVar4->field_0x0 + lVar12);
        }
        lVar6 = (long)(int)*(uint *)(puVar7 + 4);
        if ((lVar6 < 1) || (p->nObjsAlloc <= (int)*(uint *)(puVar7 + 4))) goto LAB_002fb1f4;
        if ((uVar1 < 3) && ((*(ushort *)((long)pWVar4 + lVar12 + -0x10) & 0x3f) != 6)) {
          puVar7 = &pWVar4->field_0x0 + lVar12;
        }
        else {
          puVar7 = *(undefined1 **)(&pWVar4->field_0x0 + lVar12);
        }
        uVar1 = *(uint *)(puVar7 + 4);
        if (((long)(int)uVar1 < 1) || (p->nObjsAlloc <= (int)uVar1)) goto LAB_002fb1f4;
        pWVar5 = p->pObjs;
        pcVar9 = "s";
        if ((undefined1  [24])((undefined1  [24])pWVar5[(int)uVar1] & (undefined1  [24])0x40) ==
            (undefined1  [24])0x0) {
          pcVar9 = " ";
        }
        printf("%3d%s ",(ulong)((pWVar5[lVar6].End - pWVar5[lVar6].Beg) + 1),pcVar9);
        printf(" :    ");
        pcVar9 = Wlc_ObjName(p,(int)uVar11);
        printf("%-12s =  ",pcVar9);
        if ((*(uint *)((long)pWVar4 + lVar12 + -0xc) < 3) &&
           ((*(ushort *)((long)pWVar4 + lVar12 + -0x10) & 0x3f) != 6)) {
          piVar8 = (int *)(&pWVar4->field_0x0 + lVar12);
        }
        else {
          piVar8 = *(int **)(&pWVar4->field_0x0 + lVar12);
        }
        pcVar9 = Wlc_ObjName(p,*piVar8);
        printf("%-12s  %s  ",pcVar9,pcVar3);
        if ((*(uint *)((long)pWVar4 + lVar12 + -0xc) < 3) &&
           ((*(ushort *)((long)pWVar4 + lVar12 + -0x10) & 0x3f) != 6)) {
          puVar7 = &pWVar4->field_0x0 + lVar12;
        }
        else {
          puVar7 = *(undefined1 **)(&pWVar4->field_0x0 + lVar12);
        }
        uVar10 = uVar10 + 1;
        pcVar9 = Wlc_ObjName(p,*(uint *)(puVar7 + 4));
        printf("%-12s ",pcVar9);
        putchar(10);
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x18;
    } while ((long)uVar11 < (long)p->iObj);
  }
  return;
}

Assistant:

void Wlc_NtkPrintNodes( Wlc_Ntk_t * p, int Type )
{
    Wlc_Obj_t * pObj; 
    int i, Counter = 0;
    printf( "Operation %s\n", Wlc_Names[Type] );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( (int)pObj->Type != Type )
            continue;
        printf( "%8d  :",      Counter++ );
        printf( "%8d  :  ",    i );
        printf( "%3d%s = ",    Wlc_ObjRange(pObj),                   Wlc_ObjIsSigned(pObj) ? "s" : " " );
        printf( "%3d%s  %s ",  Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin0(p, pObj)) ? "s" : " ", Wlc_Names[Type] );
        printf( "%3d%s ",      Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin1(p, pObj)) ? "s" : " " );
        printf( " :    " );
        printf( "%-12s =  ",   Wlc_ObjName(p, i) );
        printf( "%-12s  %s  ", Wlc_ObjName(p, Wlc_ObjFaninId0(pObj)), Wlc_Names[Type] );
        printf( "%-12s ",      Wlc_ObjName(p, Wlc_ObjFaninId1(pObj)) );
        printf( "\n" );
    }
}